

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::GetTargetFilePath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *name)

{
  bool bVar1;
  ulong uVar2;
  undefined1 local_40 [8];
  string path;
  string *name_local;
  cmNinjaTargetGenerator *this_local;
  
  path.field_2._8_8_ = name;
  (*(this->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[4])(local_40);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,".");
    if (!bVar1) {
      std::__cxx11::string::operator+=((string *)local_40,"/");
      std::__cxx11::string::operator+=((string *)local_40,(string *)path.field_2._8_8_);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
      goto LAB_0066176c;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path.field_2._8_8_);
LAB_0066176c:
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetTargetFilePath(
  const std::string& name) const
{
  std::string path = this->GetTargetOutputDir();
  if (path.empty() || path == ".") {
    return name;
  }
  path += "/";
  path += name;
  return path;
}